

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_int16_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  ushort uVar1;
  ushort n;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint16_t n_00;
  int iVar5;
  char *pcVar6;
  uint *puVar7;
  ushort *puVar8;
  ulong __n;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar10 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar10 != 0)) {
    puVar7 = (uint *)(uVar10 + (long)td->table);
    iVar5 = td->count;
    td->count = iVar5 + 1;
    if (iVar5 != 0) {
      pcVar9 = ctx->p;
      ctx->p = pcVar9 + 1;
      *pcVar9 = ',';
    }
    uVar10 = (ulong)*puVar7;
    iVar5 = *(int *)((long)puVar7 + uVar10);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar9 = ctx->p;
    ctx->p = pcVar9 + 1;
    *pcVar9 = '[';
    if (iVar5 == 0) {
      pcVar9 = ctx->p;
    }
    else {
      pcVar9 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar9) {
          (*ctx->flush)(ctx,0);
          pcVar9 = ctx->p;
        }
      }
      else {
        ctx->p = pcVar9 + 1;
        *pcVar9 = '\n';
        __n = (ulong)ctx->indent * (long)ctx->level;
        pcVar9 = ctx->pflush;
        pcVar6 = ctx->p;
        if (pcVar9 < pcVar6 + __n) {
          if (pcVar9 <= pcVar6) {
            (*ctx->flush)(ctx,0);
            pcVar9 = ctx->pflush;
            pcVar6 = ctx->p;
          }
          sVar11 = (long)pcVar9 - (long)pcVar6;
          if (sVar11 < __n) {
            do {
              memset(pcVar6,0x20,sVar11);
              ctx->p = ctx->p + sVar11;
              __n = __n - sVar11;
              (*ctx->flush)(ctx,0);
              pcVar6 = ctx->p;
              sVar11 = (long)ctx->pflush - (long)pcVar6;
            } while (sVar11 < __n);
          }
        }
        memset(pcVar6,0x20,__n);
        pcVar9 = ctx->p + __n;
        ctx->p = pcVar9;
      }
      uVar1 = *(ushort *)((long)puVar7 + uVar10 + 4);
      n = uVar1;
      if ((short)uVar1 < 0) {
        *pcVar9 = '-';
        pcVar9 = pcVar9 + 1;
        n = -uVar1;
      }
      iVar3 = print_uint16(n,pcVar9);
      pcVar9 = ctx->p + (iVar3 + (uint)(uVar1 >> 0xf));
      iVar5 = iVar5 + -1;
      if (iVar5 != 0) {
        puVar8 = (ushort *)((long)puVar7 + uVar10 + 6);
        do {
          ctx->p = pcVar9 + 1;
          *pcVar9 = ',';
          pcVar9 = ctx->p;
          if (ctx->indent == '\0') {
            if (ctx->pflush <= pcVar9) {
              (*ctx->flush)(ctx,0);
              pcVar9 = ctx->p;
            }
          }
          else {
            ctx->p = pcVar9 + 1;
            *pcVar9 = '\n';
            uVar10 = (ulong)ctx->indent * (long)ctx->level;
            pcVar9 = ctx->pflush;
            pcVar6 = ctx->p;
            if (pcVar9 < pcVar6 + uVar10) {
              if (pcVar9 <= pcVar6) {
                (*ctx->flush)(ctx,0);
                pcVar9 = ctx->pflush;
                pcVar6 = ctx->p;
              }
              sVar11 = (long)pcVar9 - (long)pcVar6;
              if (sVar11 < uVar10) {
                do {
                  memset(pcVar6,0x20,sVar11);
                  ctx->p = ctx->p + sVar11;
                  uVar10 = uVar10 - sVar11;
                  (*ctx->flush)(ctx,0);
                  pcVar6 = ctx->p;
                  sVar11 = (long)ctx->pflush - (long)pcVar6;
                } while (sVar11 < uVar10);
              }
            }
            memset(pcVar6,0x20,uVar10);
            pcVar9 = ctx->p + uVar10;
            ctx->p = pcVar9;
          }
          uVar1 = *puVar8;
          n_00 = uVar1;
          if ((short)uVar1 < 0) {
            *pcVar9 = '-';
            pcVar9 = pcVar9 + 1;
            n_00 = -uVar1;
          }
          iVar5 = iVar5 + -1;
          iVar3 = print_uint16(n_00,pcVar9);
          pcVar9 = ctx->p + (iVar3 + (uint)(uVar1 >> 0xf));
          ctx->p = pcVar9;
          puVar8 = puVar8 + 1;
        } while (iVar5 != 0);
      }
    }
    if (ctx->indent != '\0') {
      ctx->p = pcVar9 + 1;
      *pcVar9 = '\n';
      lVar4 = (long)ctx->level + -1;
      ctx->level = (int)lVar4;
      uVar10 = (ulong)ctx->indent * lVar4;
      pcVar9 = ctx->pflush;
      pcVar6 = ctx->p;
      if (pcVar9 < pcVar6 + uVar10) {
        if (pcVar9 <= pcVar6) {
          (*ctx->flush)(ctx,0);
          pcVar9 = ctx->pflush;
          pcVar6 = ctx->p;
        }
        sVar11 = (long)pcVar9 - (long)pcVar6;
        if (sVar11 < uVar10) {
          do {
            memset(pcVar6,0x20,sVar11);
            ctx->p = ctx->p + sVar11;
            uVar10 = uVar10 - sVar11;
            (*ctx->flush)(ctx,0);
            pcVar6 = ctx->p;
            sVar11 = (long)ctx->pflush - (long)pcVar6;
          } while (sVar11 < uVar10);
        }
      }
      memset(pcVar6,0x20,uVar10);
      pcVar9 = ctx->p + uVar10;
    }
    ctx->p = pcVar9 + 1;
    *pcVar9 = ']';
  }
  return;
}

Assistant:

static inline const void *get_field_ptr(flatcc_json_printer_table_descriptor_t *td, int id)
{
    uoffset_t vo = (uoffset_t)(id + 2) * (uoffset_t)sizeof(voffset_t);

    if (vo >= (uoffset_t)td->vsize) {
        return 0;
    }
    vo = read_voffset(td->vtable, vo);
    if (vo == 0) {
        return 0;
    }
    return (uint8_t *)td->table + vo;
}